

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O2

void MWT::save_load(mwt *c,io_buf *model_file,bool read,bool text)

{
  unsigned_long *puVar1;
  ostream *poVar2;
  feature_index *policy;
  unsigned_long *puVar3;
  policy_data *ppVar4;
  feature_index *policy_1;
  unsigned_long uVar5;
  v_array<unsigned_long> *__range2;
  size_t policies_size;
  mwt *local_1c0;
  stringstream msg;
  ostream local_1a8;
  
  if ((model_file->files)._end != (model_file->files)._begin) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    std::operator<<(&local_1a8,"total: ");
    std::ostream::_M_insert<double>(c->total);
    bin_text_read_write_fixed_validated(model_file,(char *)&c->total,8,"",read,&msg,text);
    policies_size = (long)(c->policies)._end - (long)(c->policies)._begin >> 3;
    bin_text_read_write_fixed_validated(model_file,(char *)&policies_size,8,"",read,&msg,text);
    if (read) {
      v_array<unsigned_long>::resize(&c->policies,policies_size);
      puVar3 = (c->policies)._begin;
      (c->policies)._end = puVar3 + policies_size;
    }
    else {
      std::operator<<(&local_1a8,"policies: ");
      puVar1 = (c->policies)._end;
      local_1c0 = c;
      for (puVar3 = (c->policies)._begin; puVar3 != puVar1; puVar3 = puVar3 + 1) {
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::operator<<(poVar2," ");
      }
      puVar3 = (c->policies)._begin;
      c = local_1c0;
    }
    bin_text_read_write_fixed_validated
              (model_file,(char *)puVar3,policies_size << 3,"",read,&msg,text);
    puVar1 = (c->policies)._end;
    for (puVar3 = (c->policies)._begin; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      uVar5 = *puVar3;
      ppVar4 = (c->evals)._begin;
      if (read) {
        poVar2 = std::operator<<(&local_1a8,"evals: ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<(poVar2,":");
        poVar2 = std::ostream::_M_insert<double>(ppVar4[uVar5].cost);
        std::operator<<(poVar2," ");
        uVar5 = *puVar3;
        ppVar4 = (c->evals)._begin;
      }
      bin_text_read_write_fixed_validated
                (model_file,(char *)(ppVar4 + uVar5),0x10,"",read,&msg,text);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  }
  return;
}

Assistant:

void save_load(mwt& c, io_buf& model_file, bool read, bool text)
{
  if (model_file.files.size() == 0)
    return;

  stringstream msg;

  // total
  msg << "total: " << c.total;
  bin_text_read_write_fixed_validated(model_file, (char*)&c.total, sizeof(c.total), "", read, msg, text);

  // policies
  size_t policies_size = c.policies.size();
  bin_text_read_write_fixed_validated(model_file, (char*)&policies_size, sizeof(policies_size), "", read, msg, text);

  if (read)
  {
    c.policies.resize(policies_size);
    c.policies.end() = c.policies.begin() + policies_size;
  }
  else
  {
    msg << "policies: ";
    for (feature_index& policy : c.policies) msg << policy << " ";
  }

  bin_text_read_write_fixed_validated(
      model_file, (char*)c.policies.begin(), policies_size * sizeof(feature_index), "", read, msg, text);

  // c.evals is already initialized nicely to the same size as the regressor.
  for (feature_index& policy : c.policies)
  {
    policy_data& pd = c.evals[policy];
    if (read)
      msg << "evals: " << policy << ":" << pd.action << ":" << pd.cost << " ";
    bin_text_read_write_fixed_validated(model_file, (char*)&c.evals[policy], sizeof(policy_data), "", read, msg, text);
  }
}